

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall jsonnet::internal::BuiltinFunction::~BuiltinFunction(BuiltinFunction *this)

{
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__BuiltinFunction_0022f5d8;
  std::
  _Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~_Vector_base(&(this->params).
                   super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 );
  std::__cxx11::string::~string((string *)&this->name);
  AST::~AST(&this->super_AST);
  return;
}

Assistant:

BuiltinFunction(const LocationRange &lr, const std::string &name, const Identifiers &params)
        : AST(lr, AST_BUILTIN_FUNCTION, Fodder{}), name(name), params(params)
    {
    }